

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  string *in_RDI;
  FilePath result;
  FilePath *in_stack_ffffffffffffff78;
  string *pathname;
  FilePath *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffffa0;
  FilePath *in_stack_ffffffffffffffd8;
  
  pathname = in_RDI;
  FilePath::FilePath((FilePath *)in_stack_ffffffffffffffa0);
  GetArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffffa0,0);
  FilePath::FilePath(in_stack_ffffffffffffff90,pathname);
  FilePath::Set((FilePath *)in_RDI,in_stack_ffffffffffffff78);
  FilePath::~FilePath((FilePath *)0x1a9f8a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff90);
  FilePath::RemoveDirectoryName(in_stack_ffffffffffffffd8);
  FilePath::~FilePath((FilePath *)0x1a9faf);
  return (FilePath *)pathname;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}